

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O2

SharedExNdPtr __thiscall front::syntax::SyntaxAnalyze::gm_eq_exp(SyntaxAnalyze *this)

{
  int *piVar1;
  element_type *peVar2;
  bool bVar3;
  OperationType OVar4;
  ExpressNode *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Op op;
  SyntaxAnalyze *in_RSI;
  SharedExNdPtr SVar5;
  SharedExNdPtr father;
  SharedExNdPtr second;
  string tmpName;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> local_b0;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> local_80;
  string local_70;
  string local_50;
  
  *(undefined8 *)this = 0;
  this->matched_index = 0;
  gm_rel_exp((SyntaxAnalyze *)&tmpName);
  std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)&tmpName);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&tmpName._M_string_length);
  do {
    bVar3 = try_word(in_RSI,1,EQL,NEQ);
    if (!bVar3) {
      SVar5.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = extraout_RDX._M_pi;
      SVar5.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (SharedExNdPtr)
             SVar5.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
    }
    second.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    second.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (ExpressNode *)operator_new(0x48);
    express::ExpressNode::ExpressNode(this_00);
    std::__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<front::express::ExpressNode,void>
              ((__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2> *)&father,
               this_00);
    bVar3 = try_word(in_RSI,1,EQL);
    if (bVar3) {
      match_one_word(in_RSI,EQL);
      OVar4 = EQL;
      op = Eq;
    }
    else {
      match_one_word(in_RSI,NEQ);
      OVar4 = NEQ;
      op = Neq;
    }
    (father.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _operation = OVar4;
    gm_rel_exp((SyntaxAnalyze *)&tmpName);
    std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&second.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)&tmpName);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&tmpName._M_string_length);
    piVar1 = *(int **)this;
    if ((*piVar1 == 0) &&
       ((second.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ->_type == CNS)) {
      (father.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _type = CNS;
      if ((father.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          )->_operation == EQL) {
        bVar3 = piVar1[2] ==
                (second.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_value;
      }
      else {
        if ((father.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_operation != NEQ) goto LAB_00187c5b;
        bVar3 = piVar1[2] !=
                (second.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_value;
      }
      (father.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _value = (uint)bVar3;
    }
    else {
      tmpName._M_dataplus._M_p = (pointer)&tmpName.field_2;
      tmpName._M_string_length = 0;
      tmpName.field_2._M_local_buf[0] = '\0';
      irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_(&local_50,&in_RSI->irGenerator,Int);
      std::__cxx11::string::operator=((string *)&tmpName,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      (father.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _type = VAR;
      std::__cxx11::string::_M_assign
                ((string *)
                 &(father.
                   super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_name);
      std::__cxx11::string::string((string *)&local_70,(string *)&tmpName);
      std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_80,
                 (__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)this);
      std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_90,
                 &second.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                );
      hp_gn_binary_mir(in_RSI,&local_70,(SharedExNdPtr *)&local_80,(SharedExNdPtr *)&local_90,op);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&tmpName);
    }
LAB_00187c5b:
    peVar2 = father.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_a0,
               (__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)this);
    express::ExpressNode::addChild(peVar2,(SharedExNdPtr *)&local_a0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
    peVar2 = father.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_b0,
               &second.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>);
    express::ExpressNode::addChild(peVar2,(SharedExNdPtr *)&local_b0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
    std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)this,
               &father.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&father.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&second.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  } while( true );
}

Assistant:

SharedExNdPtr SyntaxAnalyze::gm_eq_exp() {
  SharedExNdPtr first;
  first = gm_rel_exp();

  while (try_word(1, Token::EQL, Token::NEQ)) {
    SharedExNdPtr second;
    SharedExNdPtr father(new ExpressNode());
    Op op;

    if (try_word(1, Token::EQL)) {
      match_one_word(Token::EQL);
      father->_operation = OperationType::EQL;
      op = Op::Eq;
    } else {
      match_one_word(Token::NEQ);
      father->_operation = OperationType::NEQ;
      op = Op::Neq;
    }

    second = gm_rel_exp();

    if (first->_type == NodeType::CNS && second->_type == NodeType::CNS) {
      father->_type = NodeType::CNS;
      switch (father->_operation) {
        case OperationType::EQL:
          father->_value = first->_value == second->_value;
          break;
        case OperationType::NEQ:
          father->_value = first->_value != second->_value;
          break;
        default:
          break;
      }
    } else {
      string tmpName;

      tmpName = irGenerator.getNewTmpValueName(TyKind::Int);
      father->_type = NodeType::VAR;
      father->_name = tmpName;

      hp_gn_binary_mir(tmpName, first, second, op);
    }

    father->addChild(first);
    father->addChild(second);
    first = father;
  }
  return first;
}